

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

bool libcellml::isErrorRelatedToComponent(IssuePtr *error,ComponentPtr *component)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  shared_ptr<libcellml::Component> *__a;
  bool bVar1;
  CellmlElementType CVar2;
  element_type *this_00;
  Issue local_f0;
  shared_ptr<libcellml::Reset> local_e0;
  shared_ptr<const_libcellml::ParentedEntity> local_d0;
  undefined1 local_c0 [8];
  ComponentPtr parent_1;
  Issue local_a8;
  shared_ptr<libcellml::Variable> local_98;
  shared_ptr<const_libcellml::ParentedEntity> local_88;
  undefined1 local_78 [8];
  ComponentPtr parent;
  shared_ptr<libcellml::Component> local_58 [2];
  Issue local_38;
  CellmlElementType local_24;
  ComponentPtr *pCStack_20;
  CellmlElementType errorType;
  ComponentPtr *component_local;
  IssuePtr *error_local;
  
  pCStack_20 = component;
  component_local = (ComponentPtr *)error;
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             error);
  Issue::item(&local_38);
  this_00 = std::
            __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_38);
  CVar2 = AnyCellmlElement::type(this_00);
  std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr
            ((shared_ptr<libcellml::AnyCellmlElement> *)&local_38);
  __a = pCStack_20;
  local_24 = CVar2;
  if (CVar2 == COMPONENT) {
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               component_local);
    this = &parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    Issue::item((Issue *)this);
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this);
    AnyCellmlElement::component((AnyCellmlElement *)local_58);
    bVar1 = std::operator==(__a,local_58);
    std::shared_ptr<libcellml::Component>::~shared_ptr(local_58);
    std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr
              ((shared_ptr<libcellml::AnyCellmlElement> *)
               &parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (bVar1) {
      error_local._7_1_ = 1;
      goto LAB_0030f187;
    }
  }
  else {
    if (CVar2 == VARIABLE) {
      std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 component_local);
      Issue::item(&local_a8);
      std::
      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_a8);
      AnyCellmlElement::variable((AnyCellmlElement *)&local_98);
      std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
                ((shared_ptr<libcellml::ParentedEntity_const> *)&local_88,&local_98);
      owningComponent((libcellml *)local_78,(ParentedEntityConstPtr *)&local_88);
      std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_88);
      std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_98);
      std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr
                ((shared_ptr<libcellml::AnyCellmlElement> *)&local_a8);
      parent_1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_1_ = std::operator==(pCStack_20,(shared_ptr<libcellml::Component> *)local_78);
      if (parent_1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_1_) {
        error_local._7_1_ = 1;
      }
      parent_1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._5_3_ = 0;
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)local_78);
    }
    else {
      if (CVar2 != RESET) goto LAB_0030f183;
      std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 component_local);
      Issue::item(&local_f0);
      std::
      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_f0);
      AnyCellmlElement::reset((AnyCellmlElement *)&local_e0);
      std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Reset,void>
                ((shared_ptr<libcellml::ParentedEntity_const> *)&local_d0,&local_e0);
      owningComponent((libcellml *)local_c0,(ParentedEntityConstPtr *)&local_d0);
      std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_d0);
      std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_e0);
      std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr
                ((shared_ptr<libcellml::AnyCellmlElement> *)&local_f0);
      parent_1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_1_ = std::operator==(pCStack_20,(shared_ptr<libcellml::Component> *)local_c0);
      if (parent_1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_1_) {
        error_local._7_1_ = 1;
      }
      parent_1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._5_3_ = 0;
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)local_c0);
    }
    if (parent_1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ != 0) goto LAB_0030f187;
  }
LAB_0030f183:
  error_local._7_1_ = 0;
LAB_0030f187:
  return (bool)(error_local._7_1_ & 1);
}

Assistant:

bool isErrorRelatedToComponent(const IssuePtr &error, const ComponentPtr &component)
{
    auto errorType = error->item()->type();
    if (errorType == CellmlElementType::COMPONENT) {
        if (component == error->item()->component()) {
            return true;
        }
    } else if (errorType == CellmlElementType::VARIABLE) {
        auto parent = owningComponent(error->item()->variable());
        if (component == parent) {
            return true;
        }
    } else if (errorType == CellmlElementType::RESET) {
        auto parent = owningComponent(error->item()->reset());
        if (component == parent) {
            return true;
        }
    }

    return false;
}